

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::parse_equals_row(Parser *this)

{
  uint uVar1;
  int iVar2;
  pointer pTVar3;
  bool bVar4;
  Parser *this_local;
  
  while( true ) {
    pTVar3 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    uVar1 = (*pTVar3->_vptr_TextProvider[2])();
    bVar4 = false;
    if ((uVar1 & 1) != 0) {
      pTVar3 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      iVar2 = (*pTVar3->_vptr_TextProvider[5])();
      bVar4 = (char)iVar2 == '=';
    }
    if (!bVar4) break;
    pTVar3 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    (*pTVar3->_vptr_TextProvider[3])();
  }
  return;
}

Assistant:

void Parser::parse_equals_row()
{
	while(m_text_provider->is_valid() && m_text_provider->peek() == '=')
	{
		m_text_provider->advance();
	}
}